

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O2

uint64_t fiobj_str_hash(FIOBJ o)

{
  uint64_t uVar1;
  ulong uVar2;
  fio_str_info_s state;
  fio_str_info_s fStack_28;
  
  if (((uint)o & 7) == 2) {
    uVar2 = o & 0xfffffffffffffff8;
    uVar1 = *(uint64_t *)(uVar2 + 8);
    if (uVar1 == 0) {
      fio_str_info(&fStack_28,(fio_str_s_conflict *)(uVar2 + 0x10));
      uVar1 = fio_siphash13(fStack_28.data,fStack_28.len,0x13d547,0x13d858);
      *(uint64_t *)(uVar2 + 8) = uVar1;
    }
    return uVar1;
  }
  __assert_fail("FIOBJ_TYPE_IS(o, FIOBJ_T_STRING)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_str.c"
                ,0x145,"uint64_t fiobj_str_hash(FIOBJ)");
}

Assistant:

uint64_t fiobj_str_hash(FIOBJ o) {
  assert(FIOBJ_TYPE_IS(o, FIOBJ_T_STRING));
  // if (obj2str(o)->is_small) {
  //   return fiobj_hash_string(STR_INTENAL_STR(o), STR_INTENAL_LEN(o));
  // } else
  if (obj2str(o)->hash) {
    return obj2str(o)->hash;
  }
  fio_str_info_s state = fio_str_info(&obj2str(o)->str);
  obj2str(o)->hash = fiobj_hash_string(state.data, state.len);
  return obj2str(o)->hash;
}